

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterList.cpp
# Opt level: O2

string * __thiscall
bhf::StringTo<std::__cxx11::string>
          (string *__return_storage_ptr__,bhf *this,string *v,string *param_2)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)this);
  return __return_storage_ptr__;
}

Assistant:

std::string StringTo<std::string>(const std::string& v, const std::string)
{
    return v;
}